

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting_window.cpp
# Opt level: O3

void increment_counter_proc(Am_Object *inter)

{
  int iVar1;
  Am_Value *this;
  ostream *this_00;
  long *plVar2;
  Am_Object execute_cmd;
  Am_Object counter_widget;
  Am_Object AStack_28;
  Am_Object local_20;
  
  Am_Object::Get_Sibling(&local_20,(Am_Slot_Key)inter,(ulong)Am_EXECUTE_COUNTER);
  this = Am_Object::Get(&local_20,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(this);
  iVar1 = iVar1 << 2;
  Am_Object::Set(&local_20,0x169,iVar1,0);
  Am_Object::Get_Sibling(&AStack_28,(Am_Slot_Key)inter,(ulong)Am_SCRIPT_EXECUTE_COMMAND);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Setting count of ",0x11)
  ;
  this_00 = operator<<((ostream *)&std::cout,&AStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," to ",4);
  plVar2 = (long *)std::ostream::operator<<(this_00,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Set(&AStack_28,Am_EXECUTE_COUNTER,iVar1,0);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, increment_counter, (Am_Object inter))
{
  Am_Object counter_widget = inter.Get_Sibling(Am_EXECUTE_COUNTER);
  int val = 4 * (int)counter_widget.Get(Am_VALUE);
  counter_widget.Set(Am_VALUE, val);
  Am_Object execute_cmd = inter.Get_Sibling(Am_SCRIPT_EXECUTE_COMMAND);
  std::cout << "Setting count of " << execute_cmd << " to " << val << std::endl
            << std::flush;
  execute_cmd.Set(Am_EXECUTE_COUNTER, val);
}